

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswFilter.c
# Opt level: O2

Aig_Obj_t * Ssw_ManSweepBmcFilter_rec(Ssw_Man_t *p,Aig_Obj_t *pObj,int f)

{
  Aig_Man_t *pAVar1;
  Vec_Ptr_t *p_00;
  int iVar2;
  int iVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *p1;
  
  pAVar5 = p->pNodeToFrames[pObj->Id * p->nFrames + f];
  if (pAVar5 == (Aig_Obj_t *)0x0) {
    if ((*(uint *)&pObj->field_0x18 & 7) == 2) {
      pAVar1 = p->pAig;
      iVar2 = Aig_ObjCioId(pObj);
      if (iVar2 < pAVar1->nTruePis) {
        __assert_fail("!Saig_ObjIsPi(p->pAig, pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswFilter.c"
                      ,0xf7,"Aig_Obj_t *Ssw_ManSweepBmcFilter_rec(Ssw_Man_t *, Aig_Obj_t *, int)");
      }
    }
    iVar2 = Saig_ObjIsLo(p->pAig,pObj);
    if (iVar2 == 0) {
      if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswFilter.c"
                      ,0x101,"Aig_Obj_t *Ssw_ManSweepBmcFilter_rec(Ssw_Man_t *, Aig_Obj_t *, int)");
      }
      Ssw_ManSweepBmcFilter_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),f);
      Ssw_ManSweepBmcFilter_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),f);
      pAVar1 = p->pFrames;
      pAVar5 = Ssw_ObjChild0Fra(p,pObj,f);
      p1 = Ssw_ObjChild1Fra(p,pObj,f);
      pAVar5 = Aig_And(pAVar1,pAVar5,p1);
    }
    else {
      if (f < 1) {
        __assert_fail("f > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswFilter.c"
                      ,0xfa,"Aig_Obj_t *Ssw_ManSweepBmcFilter_rec(Ssw_Man_t *, Aig_Obj_t *, int)");
      }
      pAVar1 = p->pAig;
      iVar2 = Saig_ObjIsLo(pAVar1,pObj);
      if (iVar2 == 0) {
        __assert_fail("Saig_ObjIsLo(p, pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saig.h"
                      ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
      }
      p_00 = pAVar1->vCos;
      iVar2 = pAVar1->nTruePos;
      iVar3 = Aig_ObjCioId(pObj);
      pvVar4 = Vec_PtrEntry(p_00,(iVar2 + iVar3) - pAVar1->nTruePis);
      pAVar5 = Ssw_ManSweepBmcFilter_rec
                         (p,(Aig_Obj_t *)(*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe),f + -1)
      ;
      pAVar5 = (Aig_Obj_t *)((ulong)((uint)*(undefined8 *)((long)pvVar4 + 8) & 1) ^ (ulong)pAVar5);
    }
    p->pNodeToFrames[pObj->Id * p->nFrames + f] = pAVar5;
    if (pAVar5 == (Aig_Obj_t *)0x0) {
      __assert_fail("pObjNew != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswFilter.c"
                    ,0x107,"Aig_Obj_t *Ssw_ManSweepBmcFilter_rec(Ssw_Man_t *, Aig_Obj_t *, int)");
    }
  }
  return pAVar5;
}

Assistant:

Aig_Obj_t * Ssw_ManSweepBmcFilter_rec( Ssw_Man_t * p, Aig_Obj_t * pObj, int f )
{
    Aig_Obj_t * pObjNew, * pObjLi;
    pObjNew = Ssw_ObjFrame( p, pObj, f );
    if ( pObjNew )
        return pObjNew;
    assert( !Saig_ObjIsPi(p->pAig, pObj) );
    if ( Saig_ObjIsLo(p->pAig, pObj) )
    {
        assert( f > 0 );
        pObjLi  = Saig_ObjLoToLi( p->pAig, pObj );
        pObjNew = Ssw_ManSweepBmcFilter_rec( p, Aig_ObjFanin0(pObjLi), f-1 );
        pObjNew = Aig_NotCond( pObjNew, Aig_ObjFaninC0(pObjLi) );
    }
    else
    {
        assert( Aig_ObjIsNode(pObj) );
        Ssw_ManSweepBmcFilter_rec( p, Aig_ObjFanin0(pObj), f );
        Ssw_ManSweepBmcFilter_rec( p, Aig_ObjFanin1(pObj), f );
        pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
    }
    Ssw_ObjSetFrame( p, pObj, f, pObjNew );
    assert( pObjNew != NULL );
    return pObjNew;
}